

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

curl_off_t Curl_mime_size(curl_mimepart *part)

{
  void *pvVar1;
  size_t sVar2;
  curl_off_t cVar3;
  char *pcVar4;
  curl_off_t cVar5;
  long lVar6;
  long lVar7;
  curl_mimepart *part_00;
  curl_slist *pcVar8;
  
  if (part->kind == MIMEKIND_MULTIPART) {
    pvVar1 = part->arg;
    if (pvVar1 == (void *)0x0) {
      cVar5 = 0;
    }
    else {
      sVar2 = strlen(*(char **)((long)pvVar1 + 0x20));
      lVar7 = sVar2 + 6;
      part_00 = *(curl_mimepart **)((long)pvVar1 + 0x10);
      cVar5 = lVar7;
      if (part_00 != (curl_mimepart *)0x0) {
        do {
          cVar3 = Curl_mime_size(part_00);
          if (cVar3 < 0) {
            cVar5 = cVar3;
          }
          lVar6 = cVar3 + lVar7;
          if (cVar5 < 0) {
            lVar6 = 0;
          }
          cVar5 = cVar5 + lVar6;
          part_00 = part_00->nextpart;
        } while (part_00 != (curl_mimepart *)0x0);
      }
    }
    part->datasize = cVar5;
  }
  if (part->encoder == (mime_encoder *)0x0) {
    cVar5 = part->datasize;
  }
  else {
    cVar5 = (*part->encoder->sizefunc)(part);
  }
  if ((-1 < cVar5) && ((part->flags & 2) == 0)) {
    lVar7 = 0;
    for (pcVar8 = part->curlheaders; pcVar8 != (curl_slist *)0x0; pcVar8 = pcVar8->next) {
      sVar2 = strlen(pcVar8->data);
      lVar7 = lVar7 + sVar2 + 2;
    }
    lVar6 = 0;
    for (pcVar8 = part->userheaders; pcVar8 != (curl_slist *)0x0; pcVar8 = pcVar8->next) {
      pcVar4 = match_header(pcVar8,"Content-Type",0xc);
      if (pcVar4 == (char *)0x0) {
        sVar2 = strlen(pcVar8->data);
        lVar6 = lVar6 + sVar2 + 2;
      }
    }
    cVar5 = cVar5 + lVar7 + lVar6 + 2;
  }
  return cVar5;
}

Assistant:

curl_off_t Curl_mime_size(curl_mimepart *part)
{
  curl_off_t size;

  if(part->kind == MIMEKIND_MULTIPART)
    part->datasize = multipart_size(part->arg);

  size = part->datasize;

  if(part->encoder)
    size = part->encoder->sizefunc(part);

  if(size >= 0 && !(part->flags & MIME_BODY_ONLY)) {
    /* Compute total part size. */
    size += slist_size(part->curlheaders, 2, NULL);
    size += slist_size(part->userheaders, 2, "Content-Type");
    size += 2;    /* CRLF after headers. */
  }
  return size;
}